

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListModeViewBase::updateVerticalScrollBar(QListModeViewBase *this,QSize *step)

{
  QListViewPrivate *pQVar1;
  QWidgetData *pQVar2;
  ScrollMode SVar3;
  int step_00;
  QScrollBar *pQVar4;
  bool wrap;
  long lVar5;
  int iVar6;
  
  SVar3 = QAbstractItemView::verticalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  if (SVar3 == ScrollPerItem) {
    pQVar1 = (this->super_QCommonListViewBase).dd;
    if (pQVar1->flow == LeftToRight) {
      wrap = pQVar1->wrap;
      lVar5 = 0x40;
      if (wrap == true) {
LAB_00570176:
        iVar6 = *(int *)((long)&(this->super_QCommonListViewBase).qq + lVar5) + -1;
        if (iVar6 < 1) {
          pQVar4 = QAbstractScrollArea::verticalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          iVar6 = 0;
        }
        else {
          pQVar2 = ((pQVar1->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          step_00 = perItemScrollingPageSteps
                              (this,((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1,
                               (this->super_QCommonListViewBase).contentsSize.ht.m_i,wrap);
          pQVar4 = QAbstractScrollArea::verticalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          QAbstractSlider::setSingleStep(&pQVar4->super_QAbstractSlider,1);
          pQVar4 = QAbstractScrollArea::verticalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          QAbstractSlider::setPageStep(&pQVar4->super_QAbstractSlider,step_00);
          pQVar4 = QAbstractScrollArea::verticalScrollBar
                             ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
          iVar6 = iVar6 - step_00;
        }
        QAbstractSlider::setRange(&pQVar4->super_QAbstractSlider,0,iVar6);
        return;
      }
    }
    else if (pQVar1->flow == TopToBottom) {
      lVar5 = 0x88;
      if (pQVar1->wrap == false) {
        wrap = false;
        goto LAB_00570176;
      }
    }
  }
  QCommonListViewBase::updateVerticalScrollBar(&this->super_QCommonListViewBase,step);
  return;
}

Assistant:

void QListModeViewBase::updateVerticalScrollBar(const QSize &step)
{
    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem
        && ((flow() == QListView::TopToBottom && !isWrapping())
        || (flow() == QListView::LeftToRight && isWrapping()))) {
            const int steps = (flow() == QListView::TopToBottom ? scrollValueMap : segmentPositions).size() - 1;
            if (steps > 0) {
                const int pageSteps = perItemScrollingPageSteps(viewport()->height(), contentsSize.height(), isWrapping());
                verticalScrollBar()->setSingleStep(1);
                verticalScrollBar()->setPageStep(pageSteps);
                verticalScrollBar()->setRange(0, steps - pageSteps);
            } else {
                verticalScrollBar()->setRange(0, 0);
            }
            // } else if (vertical && d->isWrapping() && d->movement == Static) {
            // ### wrapped scrolling in flow direction
    } else {
        QCommonListViewBase::updateVerticalScrollBar(step);
    }
}